

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.cc
# Opt level: O2

void absl::lts_20250127::cord_internal::CordRepCrc::Destroy(CordRepCrc *node)

{
  if (node->child != (CordRep *)0x0) {
    CordRep::Unref(node->child);
  }
  crc_internal::CrcCordState::~CrcCordState(&node->crc_cord_state);
  operator_delete(node,0x20);
  return;
}

Assistant:

void CordRepCrc::Destroy(CordRepCrc* node) {
  if (node->child != nullptr) {
    CordRep::Unref(node->child);
  }
  delete node;
}